

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O3

void __thiscall flexbuffers::Builder::Finish(Builder *this)

{
  Type TVar1;
  Value *this_00;
  iterator __position;
  pointer pVVar2;
  BitWidth BVar3;
  ulong in_RAX;
  byte bVar4;
  BitWidth BVar5;
  uint8_t byte_width;
  uint uVar6;
  undefined8 uStack_28;
  
  this_00 = (this->stack_).
            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(this->stack_).
            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 == 0x10) {
    uStack_28 = in_RAX;
    BVar3 = Value::ElemWidth(this_00,(long)(this->buf_).
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->buf_).
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start,0);
    uVar6 = 1 << ((byte)BVar3 & 0x1f);
    __position._M_current =
         (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uStack_28 = uStack_28 & 0xffffffffffffff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
              (&this->buf_,__position,
               (ulong)uVar6 - 1 &
               (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start - (long)__position._M_current,
               (value_type_conflict1 *)((long)&uStack_28 + 7));
    byte_width = (uint8_t)uVar6;
    WriteAny(this,(this->stack_).
                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start,byte_width);
    pVVar2 = (this->stack_).
             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    BVar3 = pVVar2->min_bit_width_;
    BVar5 = BIT_WIDTH_8;
    if (0 < (int)BVar3) {
      BVar5 = BVar3;
    }
    TVar1 = pVVar2->type_;
    if (TVar1 == FBT_BOOL) {
      BVar3 = BVar5;
    }
    bVar4 = (byte)BVar3;
    if ((int)TVar1 < 4) {
      bVar4 = (byte)BVar5;
    }
    uStack_28._0_6_ = CONCAT15((byte)(TVar1 << 2) | bVar4,(undefined5)uStack_28);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,
               (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,(long)&uStack_28 + 5);
    uStack_28._0_7_ = CONCAT16(byte_width,(undefined6)uStack_28);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,
               (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,(long)&uStack_28 + 6);
    this->finished_ = true;
    return;
  }
  __assert_fail("stack_.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x580,"void flexbuffers::Builder::Finish()");
}

Assistant:

void Finish() {
    // If you hit this assert, you likely have objects that were never included
    // in a parent. You need to have exactly one root to finish a buffer.
    // Check your Start/End calls are matched, and all objects are inside
    // some other object.
    FLATBUFFERS_ASSERT(stack_.size() == 1);

    // Write root value.
    auto byte_width = Align(stack_[0].ElemWidth(buf_.size(), 0));
    WriteAny(stack_[0], byte_width);
    // Write root type.
    Write(stack_[0].StoredPackedType(), 1);
    // Write root size. Normally determined by parent, but root has no parent :)
    Write(byte_width, 1);

    finished_ = true;
  }